

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FenceVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::FenceVkImpl::~FenceVkImpl(FenceVkImpl *this)

{
  ~FenceVkImpl(this);
  free(this);
  return;
}

Assistant:

FenceVkImpl::~FenceVkImpl()
{
    if (IsTimelineSemaphore())
    {
        VERIFY_EXPR(m_SyncPoints.empty());
        m_pDevice->SafeReleaseDeviceObject(std::move(m_TimelineSemaphore), ~0ull);
    }
    else if (!m_SyncPoints.empty())
    {
        LOG_INFO_MESSAGE("FenceVkImpl::~FenceVkImpl(): waiting for ", m_SyncPoints.size(), " pending Vulkan ",
                         (m_SyncPoints.size() > 1 ? "fences." : "fence."));
        // Vulkan spec states that all queue submission commands that refer to
        // a fence must have completed execution before the fence is destroyed.
        // (https://www.khronos.org/registry/vulkan/specs/1.1-extensions/html/vkspec.html#VUID-vkDestroyFence-fence-01120)
        Wait(UINT64_MAX);
    }

#ifdef DILIGENT_DEVELOPMENT
    if (m_MaxSyncPoints > RequiredArraySize * 2)
        LOG_WARNING_MESSAGE("Max queue size of pending fences is too big. This may indicate that none of the GetCompletedValue(), Wait() or ExtractSignalSemaphore() have been used.");
#endif
}